

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O3

void __thiscall QMenuBar::mousePressEvent(QMenuBar *this,QMouseEvent *e)

{
  long lVar1;
  long *plVar2;
  QMenuBarPrivate *this_00;
  long lVar3;
  Data *pDVar4;
  QWidget *this_01;
  char cVar5;
  bool bVar6;
  QAction *action;
  QObject *pQVar7;
  long lVar8;
  QPoint p;
  long in_FS_OFFSET;
  double dVar9;
  undefined1 auVar10 [16];
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(e + 0x40) == 1) {
    this_00 = *(QMenuBarPrivate **)&(this->super_QWidget).field_0x8;
    this_00->field_0x298 = this_00->field_0x298 | 1;
    auVar10 = QEventPoint::position();
    dVar9 = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar10._0_8_
    ;
    bVar6 = 2147483647.0 < dVar9;
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    p.xp.m_i = (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar9);
    dVar9 = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar10._8_8_
    ;
    bVar6 = 2147483647.0 < dVar9;
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    p.yp.m_i = (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar9);
    action = QMenuBarPrivate::actionAt(this_00,p);
    if (action != (QAction *)0x0) {
      lVar3 = (this_00->hiddenActions).d.size;
      if (lVar3 != 0) {
        lVar8 = 0;
        do {
          if (lVar3 << 3 == lVar8) goto LAB_00465ebe;
          lVar1 = lVar8 + 8;
          plVar2 = (long *)((long)(this_00->hiddenActions).d.ptr + lVar8);
          lVar8 = lVar1;
        } while ((QAction *)*plVar2 != action);
        if (lVar1 != 0) goto LAB_00465ef1;
      }
LAB_00465ebe:
      cVar5 = QAction::isEnabled();
      if (cVar5 != '\0') {
        pDVar4 = (this_00->currentAction).wp.d;
        if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
          pQVar7 = (QObject *)0x0;
        }
        else {
          pQVar7 = (this_00->currentAction).wp.value;
        }
        if ((pQVar7 != (QObject *)action) || ((this_00->field_0x2a0 & 1) == 0)) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            QMenuBarPrivate::setCurrentAction(this_00,action,true,false);
            return;
          }
          goto LAB_00466082;
        }
        pDVar4 = (this_00->activeMenu).wp.d;
        if ((pDVar4 != (Data *)0x0) &&
           ((*(int *)(pDVar4 + 4) != 0 &&
            (this_01 = (QWidget *)(this_00->activeMenu).wp.value, this_01 != (QWidget *)0x0)))) {
          (this_00->activeMenu).wp.d = (Data *)0x0;
          (this_00->activeMenu).wp.value = (QObject *)0x0;
          LOCK();
          *(int *)pDVar4 = *(int *)pDVar4 + -1;
          UNLOCK();
          if (*(int *)pDVar4 == 0) {
            operator_delete(pDVar4);
          }
          QWidget::setAttribute(this_01,WA_NoMouseReplay,true);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            QWidget::hide(this_01);
            return;
          }
          goto LAB_00466082;
        }
        goto LAB_00465fb4;
      }
    }
LAB_00465ef1:
    QMenuBarPrivate::setCurrentAction(this_00,(QAction *)0x0,false,false);
    bVar6 = QWhatsThis::inWhatsThisMode();
    if (bVar6) {
      auVar10 = QEventPoint::globalPosition();
      dVar9 = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
              auVar10._0_8_;
      bVar6 = 2147483647.0 < dVar9;
      if (dVar9 <= -2147483648.0) {
        dVar9 = -2147483648.0;
      }
      local_30.xp.m_i =
           (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar9);
      dVar9 = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
              auVar10._8_8_;
      bVar6 = 2147483647.0 < dVar9;
      if (dVar9 <= -2147483648.0) {
        dVar9 = -2147483648.0;
      }
      local_30.yp.m_i =
           (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar9);
      QWhatsThis::showText
                (&local_30,&(this_00->super_QWidgetPrivate).whatsThis,&this->super_QWidget);
    }
  }
LAB_00465fb4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00466082:
  __stack_chk_fail();
}

Assistant:

void QMenuBar::mousePressEvent(QMouseEvent *e)
{
    Q_D(QMenuBar);
    if (e->button() != Qt::LeftButton)
        return;

    d->mouseDown = true;

    QAction *action = d->actionAt(e->position().toPoint());
    if (!action || !d->isVisible(action) || !action->isEnabled()) {
        d->setCurrentAction(nullptr);
#if QT_CONFIG(whatsthis)
        if (QWhatsThis::inWhatsThisMode())
            QWhatsThis::showText(e->globalPosition().toPoint(), d->whatsThis, this);
#endif
        return;
    }

    if (d->currentAction == action && d->popupState) {
        if (QMenu *menu = d->activeMenu) {
            d->activeMenu = nullptr;
            menu->setAttribute(Qt::WA_NoMouseReplay);
            menu->hide();
        }
    } else {
        d->setCurrentAction(action, true);
    }
}